

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldGenerator::GenerateParsingCode
          (RepeatedImmutablePrimitiveFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  RepeatedImmutablePrimitiveFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "if (!$get_mutable_bit_parser$) {\n  $name$_ = $create_list$;\n  $set_mutable_bit_parser$;\n}\n$repeated_add$(input.read$capitalized_type$());\n"
                    );
  return;
}

Assistant:

void RepeatedImmutablePrimitiveFieldGenerator::GenerateParsingCode(
    io::Printer* printer) const {
  printer->Print(variables_,
                 "if (!$get_mutable_bit_parser$) {\n"
                 "  $name$_ = $create_list$;\n"
                 "  $set_mutable_bit_parser$;\n"
                 "}\n"
                 "$repeated_add$(input.read$capitalized_type$());\n");
}